

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness
          (DescriptorBuilder *this,string_view message_name,DescriptorProto *message,
          Descriptor *descriptor,bool use_custom_names)

{
  undefined1 (*pauVar1) [16];
  ctrl_t *pcVar2;
  slot_type *__n;
  uint uVar3;
  undefined8 uVar4;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined8 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined8 uVar21;
  key_equal *pkVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  bool bVar32;
  ushort uVar33;
  int iVar34;
  Rep *pRVar35;
  size_t *psVar36;
  uint64_t uVar37;
  size_t sVar38;
  reference ppVar39;
  DescriptorProto *pDVar40;
  ulong uVar41;
  uint64_t v;
  undefined8 uVar42;
  DescriptorProto *pDVar43;
  ulong uVar44;
  FieldDescriptorProto *pFVar45;
  char cVar46;
  undefined3 in_register_00000089;
  undefined4 uVar47;
  undefined4 in_register_0000008c;
  uint uVar48;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar49;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_00;
  anon_union_8_1_a8a14541_for_iterator_2 ts;
  anon_union_8_1_a8a14541_for_iterator_2 aVar50;
  long *plVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  string_view input;
  FindInfo target;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>::iterator,_bool>
  it_inserted;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
  name_to_field;
  JsonNameDetails details;
  anon_class_24_3_4f82d86e make_error;
  __m128i match;
  __m128i match_1;
  DescriptorProto *local_1e0;
  undefined1 local_1d8 [32];
  DescriptorProto *local_1b8;
  ulong local_1b0;
  FieldDescriptorProto *local_1a8;
  DescriptorProto *local_1a0;
  undefined1 local_198 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  DescriptorProto *local_170;
  anon_union_8_1_a8a14541_for_iterator_2 local_168;
  undefined4 local_15c;
  undefined1 local_158 [8];
  undefined1 local_150 [16];
  undefined1 local_140 [40];
  uint local_118;
  undefined1 uStack_114;
  undefined1 uStack_113;
  undefined1 uStack_112;
  undefined1 uStack_111;
  undefined1 uStack_110;
  undefined1 uStack_10f;
  undefined1 uStack_10e;
  undefined1 uStack_10d;
  undefined1 uStack_10c;
  undefined1 uStack_10b;
  undefined1 uStack_10a;
  undefined1 uStack_109;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8 [4];
  string local_a8 [16];
  char local_98 [24];
  code *pcStack_80;
  undefined8 local_78;
  code *pcStack_70;
  undefined8 local_68;
  code *pcStack_60;
  iterator local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar47 = CONCAT31(in_register_00000089,use_custom_names);
  local_f8 = message_name._M_str;
  local_100 = message_name._M_len;
  local_198._0_16_ = (undefined1  [16])0x0;
  local_170 = (DescriptorProto *)(absl::lts_20250127::container_internal::kEmptyGroup + 0x10);
  local_198._16_8_ = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  this_00 = &(message->field_0)._impl_.field_;
  pDVar43 = message;
  pRVar49 = this_00;
  local_15c = uVar47;
  local_108 = this;
  local_e8[3].rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)descriptor;
  if ((undefined1  [224])((undefined1  [224])message->field_0 & (undefined1  [224])0x1) !=
      (undefined1  [224])0x0) {
    pRVar35 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    pRVar49 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar35->elements;
  }
  if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar35 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    this_00 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar35->elements;
  }
  local_e8[3].eq =
       (key_equal *)
       (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
       *(int *)((long)&message->field_0 + 0x10));
  if ((key_equal *)pRVar49 != local_e8[3].eq) {
    do {
      pDVar40 = (DescriptorProto *)(local_1d8 + 0x10);
      local_1b8 = (DescriptorProto *)(pRVar49->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
      psVar36 = (size_t *)
                ((ulong)(local_1b8->field_0)._impl_.field_.super_RepeatedPtrFieldBase.
                        tagged_rep_or_elem_ & 0xfffffffffffffffc);
      input._M_str = (char *)pDVar43;
      input._M_len = *psVar36;
      protobuf::(anonymous_namespace)::ToJsonName_abi_cxx11_
                ((string *)local_1d8,(_anonymous_namespace_ *)psVar36[1],input);
      if (((char)local_15c == '\0') ||
         ((undefined1  [224])((undefined1  [224])local_1b8->field_0 & (undefined1  [224])0x10) ==
          (undefined1  [224])0x0)) {
LAB_001cd242:
        local_150._0_8_ = local_140;
        local_158 = (undefined1  [8])local_1b8;
        if ((DescriptorProto *)local_1d8._0_8_ == pDVar40) {
          local_140._8_8_ = local_1d8._24_8_;
        }
        else {
          local_150._0_8_ = local_1d8._0_8_;
        }
        local_140._1_7_ = local_1d8._17_7_;
        local_140[0] = local_1d8[0x10];
        local_150._8_8_ = local_1d8._8_8_;
        local_1d8._8_8_ = (slot_type *)0x0;
        local_1d8[0x10] = '\0';
        local_140[0x10] = 0;
        local_1d8._0_8_ = pDVar40;
      }
      else {
        uVar41._0_4_ = *(int *)((long)&local_1b8->field_0 + 0x28);
        uVar41._4_4_ = *(int *)((long)&local_1b8->field_0 + 0x2c);
        plVar51 = (long *)(uVar41 & 0xfffffffffffffffc);
        __n = (slot_type *)plVar51[1];
        if ((__n == (slot_type *)local_1d8._8_8_) &&
           ((__n == (slot_type *)0x0 ||
            (iVar34 = bcmp((void *)*plVar51,(void *)local_1d8._0_8_,(size_t)__n), iVar34 == 0))))
        goto LAB_001cd242;
        local_150._0_8_ = local_140;
        local_158 = (undefined1  [8])local_1b8;
        std::__cxx11::string::_M_construct<char*>((string *)local_150,*plVar51,(long)__n + *plVar51)
        ;
        local_140[0x10] = 1;
      }
      if ((DescriptorProto *)local_1d8._0_8_ != pDVar40) {
        operator_delete((void *)local_1d8._0_8_,CONCAT71(local_1d8._17_7_,local_1d8[0x10]) + 1);
      }
      uVar31 = local_140[0x10];
      if (local_140[0x10] == 1) {
        local_a8._0_8_ = local_98;
        std::__cxx11::string::_M_construct<char*>
                  (local_a8,local_150._0_8_,(ctrl_t *)(local_150._8_8_ + local_150._0_8_));
        if (((Arena *)local_a8._8_8_ == (Arena *)0x0) || (*(char *)local_a8._0_8_ != '['))
        goto LAB_001cd322;
        bVar52 = ((char *)(local_a8._0_8_ + -1))[local_a8._8_8_] == ']';
      }
      else {
LAB_001cd322:
        bVar52 = false;
      }
      if ((uVar31 != 0) && ((char *)local_a8._0_8_ != local_98)) {
        operator_delete((void *)local_a8._0_8_,local_98._0_8_ + 1);
      }
      if (!bVar52) {
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                    *)local_198);
        uVar42 = local_150._8_8_;
        uVar37 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                           (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,
                            local_150._0_8_,local_150._8_8_);
        uVar4 = local_198._0_8_;
        if (((ulong)((long)&(((Message *)local_198._0_8_)->super_MessageLite)._vptr_MessageLite + 1U
                    ) & local_198._0_8_) != 0) goto LAB_001cdd98;
        uVar44 = (uVar37 ^ uVar42) * -0x234dd359734ecb13;
        pFVar45 = (FieldDescriptorProto *)
                  (uVar44 >> 0x38 | (uVar44 & 0xff000000000000) >> 0x28 |
                   (uVar44 & 0xff0000000000) >> 0x18 | (uVar44 & 0xff00000000) >> 8 |
                   (uVar44 & 0xff000000) << 8 | (uVar44 & 0xff0000) << 0x18 |
                   (uVar44 & 0xff00) << 0x28 | uVar44 << 0x38);
        uVar41 = ((ulong)pFVar45 >> 7 ^ (ulong)local_198._16_8_ >> 0xc) & local_198._0_8_;
        uVar31 = (undefined1)(uVar44 >> 0x38);
        auVar53 = ZEXT216(CONCAT11(uVar31,uVar31) & 0x7f7f);
        auVar53 = pshuflw(auVar53,auVar53,0);
        local_e8[2].rhs._0_4_ = auVar53._0_4_;
        local_e8[2].rhs._4_4_ = local_e8[2].rhs._0_4_;
        local_e8[2].eq._0_4_ = local_e8[2].rhs._0_4_;
        local_e8[2].eq._4_4_ = local_e8[2].rhs._0_4_;
        uVar47 = CONCAT31((int3)((uint)uVar47 >> 8),local_1d8[0x10]);
        local_1b0 = 0;
        uVar42 = local_198._16_8_;
        pDVar40 = (DescriptorProto *)local_1d8._0_8_;
        aVar50 = (anon_union_8_1_a8a14541_for_iterator_2)local_1d8._8_8_;
        local_1a8 = pFVar45;
        local_140._32_8_ = pRVar49;
        do {
          uVar21 = local_180._M_allocated_capacity;
          pcVar2 = (ctrl_t *)(uVar42 + uVar41);
          auVar53[0] = -((ctrl_t)local_e8[2].rhs == *pcVar2);
          auVar53[1] = -(local_e8[2].rhs._1_1_ == pcVar2[1]);
          auVar53[2] = -(local_e8[2].rhs._2_1_ == pcVar2[2]);
          auVar53[3] = -(local_e8[2].rhs._3_1_ == pcVar2[3]);
          auVar53[4] = -(local_e8[2].rhs._4_1_ == pcVar2[4]);
          auVar53[5] = -(local_e8[2].rhs._5_1_ == pcVar2[5]);
          auVar53[6] = -(local_e8[2].rhs._6_1_ == pcVar2[6]);
          auVar53[7] = -(local_e8[2].rhs._7_1_ == pcVar2[7]);
          auVar53[8] = -((ctrl_t)local_e8[2].eq == pcVar2[8]);
          auVar53[9] = -(local_e8[2].eq._1_1_ == pcVar2[9]);
          auVar53[10] = -(local_e8[2].eq._2_1_ == pcVar2[10]);
          auVar53[0xb] = -(local_e8[2].eq._3_1_ == pcVar2[0xb]);
          auVar53[0xc] = -(local_e8[2].eq._4_1_ == pcVar2[0xc]);
          auVar53[0xd] = -(local_e8[2].eq._5_1_ == pcVar2[0xd]);
          auVar53[0xe] = -(local_e8[2].eq._6_1_ == pcVar2[0xe]);
          auVar53[0xf] = -(local_e8[2].eq._7_1_ == pcVar2[0xf]);
          uVar33 = (ushort)(SUB161(auVar53 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar53[0xf] >> 7) << 0xf;
          uVar48 = (uint)uVar33;
          cVar46 = (char)uVar47;
          local_1e0 = (DescriptorProto *)CONCAT71(local_1e0._1_7_,cVar46);
          uVar31 = *pcVar2;
          uVar5 = pcVar2[1];
          uVar6 = pcVar2[2];
          uVar7 = pcVar2[3];
          uVar8 = pcVar2[4];
          uVar9 = pcVar2[5];
          uVar10 = pcVar2[6];
          uVar11 = pcVar2[7];
          uVar23 = pcVar2[8];
          uVar24 = pcVar2[9];
          uVar25 = pcVar2[10];
          uVar26 = pcVar2[0xb];
          uVar27 = pcVar2[0xc];
          uVar28 = pcVar2[0xd];
          uVar29 = pcVar2[0xe];
          uVar30 = pcVar2[0xf];
          uVar12 = _local_118;
          uVar13 = uStack_110;
          uVar14 = uStack_10f;
          uVar15 = uStack_10e;
          uVar16 = uStack_10d;
          uVar17 = uStack_10c;
          uVar18 = uStack_10b;
          uVar19 = uStack_10a;
          uVar20 = uStack_109;
          _local_118 = *(DescriptorProto **)pcVar2;
          while (uStack_109 = uVar30, uStack_10a = uVar29, uStack_10b = uVar28, uStack_10c = uVar27,
                uStack_10d = uVar26, uStack_10e = uVar25, uStack_10f = uVar24, uStack_110 = uVar23,
                pDVar43 = (DescriptorProto *)uVar4, local_1a0 = pDVar40, uVar33 != 0) {
            uVar3 = 0;
            if (uVar48 != 0) {
              for (; (uVar48 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
              }
            }
            local_e8[0].rhs =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150;
            local_e8[0].eq = (key_equal *)local_198;
            uVar44 = uVar3 + uVar41 & uVar4;
            ts.slot_ = (slot_type *)(uVar44 * 0x50 + uVar21);
            local_168 = aVar50;
            local_f0 = uVar42;
            bVar52 = absl::lts_20250127::container_internal::
                     hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,void>
                     ::
                     apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>::EqualElement<std::__cxx11::string>,std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>&,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>>
                               (local_e8,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>
                                          *)ts.slot_);
            pRVar49 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)local_140._32_8_;
            if (bVar52) {
              local_1d8._8_8_ = local_168;
              local_1d8._0_8_ = local_1a0;
              local_1d8[0x10] = cVar46;
              if ((ctrl_t *)local_198._16_8_ == (ctrl_t *)0x0) goto LAB_001cddce;
              local_1d8._0_8_ = local_198._16_8_ + uVar44;
              local_1d8[0x10] = '\0';
              local_1d8._8_8_ = ts.slot_;
              goto LAB_001cd69a;
            }
            uVar33 = (ushort)(uVar48 - 1) & (ushort)uVar48;
            uVar48 = CONCAT22((short)(uVar48 - 1 >> 0x10),uVar33);
            uVar47 = CONCAT31((int3)((uint)uVar47 >> 8),cVar46);
            uVar42 = local_f0;
            pFVar45 = local_1a8;
            pDVar40 = local_1a0;
            aVar50 = local_168;
            uVar31 = (undefined1)local_118;
            uVar5 = local_118._1_1_;
            uVar6 = local_118._2_1_;
            uVar7 = local_118._3_1_;
            uVar8 = uStack_114;
            uVar9 = uStack_113;
            uVar10 = uStack_112;
            uVar11 = uStack_111;
            uVar23 = uStack_110;
            uVar24 = uStack_10f;
            uVar25 = uStack_10e;
            uVar26 = uStack_10d;
            uVar27 = uStack_10c;
            uVar28 = uStack_10b;
            uVar29 = uStack_10a;
            uVar30 = uStack_109;
            uVar12 = _local_118;
            uVar13 = uStack_110;
            uVar14 = uStack_10f;
            uVar15 = uStack_10e;
            uVar16 = uStack_10d;
            uVar17 = uStack_10c;
            uVar18 = uStack_10b;
            uVar19 = uStack_10a;
            uVar20 = uStack_109;
          }
          auVar56[0] = -(uVar31 == kEmpty);
          auVar56[1] = -(uVar5 == kEmpty);
          auVar56[2] = -(uVar6 == kEmpty);
          auVar56[3] = -(uVar7 == kEmpty);
          auVar56[4] = -(uVar8 == kEmpty);
          auVar56[5] = -(uVar9 == kEmpty);
          auVar56[6] = -(uVar10 == kEmpty);
          auVar56[7] = -(uVar11 == kEmpty);
          auVar56[8] = -(uStack_110 == kEmpty);
          auVar56[9] = -(uStack_10f == kEmpty);
          auVar56[10] = -(uStack_10e == kEmpty);
          auVar56[0xb] = -(uStack_10d == kEmpty);
          auVar56[0xc] = -(uStack_10c == kEmpty);
          auVar56[0xd] = -(uStack_10b == kEmpty);
          auVar56[0xe] = -(uStack_10a == kEmpty);
          auVar56[0xf] = -(uStack_109 == kEmpty);
          local_118 = CONCAT22(0,(ushort)(SUB161(auVar56 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar56 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar56 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar56 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar56 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar56 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar56 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar56 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar56 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar56 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar56 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar56 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar56 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar56 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar56 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(auVar56[0xf] >> 7) << 0xf);
          _uStack_114 = (undefined4)((ulong)uVar12 >> 0x20);
          uStack_110 = uVar13;
          uStack_10f = uVar14;
          uStack_10e = uVar15;
          uStack_10d = uVar16;
          uStack_10c = uVar17;
          uStack_10b = uVar18;
          uStack_10a = uVar19;
          uStack_109 = uVar20;
          if (local_118 == 0) {
            if ((ulong)local_198._0_8_ < local_1b0 + 0x10) {
              local_1d8[0x10] = (undefined1)uVar47;
              local_1d8._0_8_ = pDVar40;
              local_1d8._8_8_ = aVar50;
              __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xf7d,
                            "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, K = std::basic_string<char>]"
                           );
            }
            uVar41 = local_1b0 + 0x10 + uVar41 & uVar4;
            local_1b0 = local_1b0 + 0x10;
          }
          else {
            bVar52 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                               (local_198._0_8_,(size_t)pFVar45,(ctrl_t *)local_198._16_8_);
            if (bVar52) {
              uVar33 = 0xf;
              if ((undefined2)local_118 != 0) {
                for (; (ushort)(undefined2)local_118 >> uVar33 == 0; uVar33 = uVar33 - 1) {
                }
              }
              uVar48 = (ushort)((uVar33 ^ 0xfff0) + 0x11) - 1;
            }
            else {
              uVar48 = 0;
              if (local_118 != 0) {
                for (; (local_118 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                }
              }
            }
            target.probe_length =
                 (size_t)absl::lts_20250127::container_internal::
                         raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
                         ::GetPolicyFunctions()::value;
            target.offset = local_1b0;
            sVar38 = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                               ((container_internal *)local_198,(CommonFields *)local_1a8,
                                uVar48 + uVar41 & uVar4,target,
                                (PolicyFunctions *)CONCAT44(in_register_0000008c,uVar47));
            if ((ctrl_t *)local_198._16_8_ == (ctrl_t *)0x0) {
              local_1d8._0_8_ = local_1a0;
              local_1d8._8_8_ = aVar50;
              local_1d8[0x10] = cVar46;
LAB_001cddce:
              __assert_fail("ctrl != nullptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x9ef,
                            "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>]"
                           );
            }
            pDVar40 = (DescriptorProto *)(local_198._16_8_ + sVar38);
            aVar50.slot_ = (slot_type *)(sVar38 * 0x50 + local_180._M_allocated_capacity);
            uVar47 = CONCAT31((int3)((uint)uVar47 >> 8),1);
            pFVar45 = local_1a8;
          }
        } while ((undefined2)local_118 == 0);
        local_1d8[0x10] = (undefined1)uVar47;
        local_1d8._0_8_ = pDVar40;
        local_1d8._8_8_ = aVar50;
LAB_001cd69a:
        uVar4 = local_1d8._8_8_;
        if (local_1d8[0x10] == '\x01') {
          local_140._24_8_ = local_1d8._0_8_;
          local_58.ctrl_ = (ctrl_t *)local_1d8._0_8_;
          local_58.field_1.slot_ = (slot_type *)local_1d8._8_8_;
          uVar42 = local_198._0_8_;
          local_198._0_8_ = 0xffffffffffffff9c;
          *(anon_union_224_1_493b367e_for_DescriptorProto_3 **)local_1d8._8_8_ =
               (anon_union_224_1_493b367e_for_DescriptorProto_3 *)(local_1d8._8_8_ + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1d8._8_8_,local_150._0_8_,
                     (ctrl_t *)(local_150._8_8_ + local_150._0_8_));
          ((JsonNameDetails *)(uVar4 + 0x20))->field = (FieldDescriptorProto *)local_158;
          (((string *)(uVar4 + 0x28))->_M_dataplus)._M_p = (pointer)(uVar4 + 0x38);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(uVar4 + 0x28),local_150._0_8_,
                     (ctrl_t *)(local_150._8_8_ + local_150._0_8_));
          *(undefined1 *)(uVar4 + 0x48) = local_140[0x10];
          absl::lts_20250127::container_internal::CommonFields::set_capacity
                    ((CommonFields *)local_198,uVar42);
          aVar50.slot_ = (slot_type *)
                         absl::lts_20250127::container_internal::
                         raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                         ::iterator::operator*(&local_58);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
          ::AssertNotDebugCapacity
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                      *)local_198);
          uVar41 = ((InternalMetadata *)((long)aVar50.slot_ + 8))->ptr_;
          uVar37 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                             (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,
                              *(undefined8 *)aVar50.slot_,uVar41);
          local_168.slot_ = aVar50.slot_;
          if (((ulong)((long)&(((Message *)local_198._0_8_)->super_MessageLite)._vptr_MessageLite +
                      1U) & local_198._0_8_) != 0) goto LAB_001cdd98;
          uVar41 = (uVar37 ^ uVar41) * -0x234dd359734ecb13;
          local_f0 = local_198._16_8_;
          local_1a0 = (DescriptorProto *)
                      (((uVar41 >> 0x38 | (uVar41 & 0xff000000000000) >> 0x28 |
                         (uVar41 & 0xff0000000000) >> 0x18 | (uVar41 & 0xff00000000) >> 8 |
                         (uVar41 & 0xff000000) << 8 | (uVar41 & 0xff0000) << 0x18 |
                         (uVar41 & 0xff00) << 0x28 | uVar41 << 0x38) >> 7 ^
                       (ulong)local_198._16_8_ >> 0xc) & local_198._0_8_);
          uVar31 = (undefined1)(uVar41 >> 0x38);
          auVar53 = ZEXT216(CONCAT11(uVar31,uVar31) & 0x7f7f);
          auVar53 = pshuflw(auVar53,auVar53,0);
          local_48 = auVar53._0_4_;
          uVar41 = 0;
          local_1a8 = (FieldDescriptorProto *)local_198._0_8_;
          local_e8[1].eq = (key_equal *)uVar4;
          pFVar45 = (FieldDescriptorProto *)local_198._0_8_;
          uStack_44 = local_48;
          uStack_40 = local_48;
          uStack_3c = local_48;
          do {
            uVar42 = local_180._M_allocated_capacity;
            uVar4 = local_198._16_8_;
            pauVar1 = (undefined1 (*) [16])
                      ((long)&(local_1a0->super_Message).super_MessageLite._vptr_MessageLite +
                      local_f0);
            local_e8[2] = *(EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)pauVar1;
            auVar54[0] = -((char)local_48 == (*pauVar1)[0]);
            auVar54[1] = -(local_48._1_1_ == (*pauVar1)[1]);
            auVar54[2] = -(local_48._2_1_ == (*pauVar1)[2]);
            auVar54[3] = -(local_48._3_1_ == (*pauVar1)[3]);
            auVar54[4] = -((char)uStack_44 == (*pauVar1)[4]);
            auVar54[5] = -(uStack_44._1_1_ == (*pauVar1)[5]);
            auVar54[6] = -(uStack_44._2_1_ == (*pauVar1)[6]);
            auVar54[7] = -(uStack_44._3_1_ == (*pauVar1)[7]);
            auVar54[8] = -((char)uStack_40 == (*pauVar1)[8]);
            auVar54[9] = -(uStack_40._1_1_ == (*pauVar1)[9]);
            auVar54[10] = -(uStack_40._2_1_ == (*pauVar1)[10]);
            auVar54[0xb] = -(uStack_40._3_1_ == (*pauVar1)[0xb]);
            auVar54[0xc] = -((char)uStack_3c == (*pauVar1)[0xc]);
            auVar54[0xd] = -(uStack_3c._1_1_ == (*pauVar1)[0xd]);
            auVar54[0xe] = -(uStack_3c._2_1_ == (*pauVar1)[0xe]);
            auVar54[0xf] = -(uStack_3c._3_1_ == (*pauVar1)[0xf]);
            uVar33 = (ushort)(SUB161(auVar54 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar54[0xf] >> 7) << 0xf;
            uVar48 = (uint)uVar33;
            bVar52 = uVar33 == 0;
            local_1b0 = uVar41;
            if (!bVar52) {
              bVar52 = false;
              do {
                uVar3 = 0;
                if (uVar48 != 0) {
                  for (; (uVar48 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                  }
                }
                local_e8[0].eq = (key_equal *)local_198;
                uVar41 = (ulong)((long)&(local_1a0->super_Message).super_MessageLite.
                                        _vptr_MessageLite + (ulong)uVar3) & (ulong)pFVar45;
                pDVar43 = (DescriptorProto *)(uVar41 * 0x50 + uVar42);
                local_e8[0].rhs =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aVar50;
                bVar32 = absl::lts_20250127::container_internal::
                         hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,void>
                         ::
                         apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>::EqualElement<std::__cxx11::string>,std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>&,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>>
                                   (local_e8,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>
                                              *)pDVar43);
                if (bVar32) {
                  if ((ctrl_t *)uVar4 == (ctrl_t *)0x0) goto LAB_001cddce;
                  local_1e0 = (DescriptorProto *)(uVar4 + uVar41);
                  _local_118 = pDVar43;
                }
                pFVar45 = local_1a8;
                aVar50 = local_168;
                if (bVar32) break;
                uVar33 = (ushort)(uVar48 - 1) & (ushort)uVar48;
                uVar48 = CONCAT22((short)(uVar48 - 1 >> 0x10),uVar33);
                bVar52 = uVar33 == 0;
              } while (!bVar52);
            }
            pkVar22 = local_e8[1].eq;
            pRVar49 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)local_140._32_8_;
            if (bVar52) {
              auVar55[0] = -(local_e8[2].rhs._0_1_ == -0x80);
              auVar55[1] = -(local_e8[2].rhs._1_1_ == -0x80);
              auVar55[2] = -(local_e8[2].rhs._2_1_ == -0x80);
              auVar55[3] = -(local_e8[2].rhs._3_1_ == -0x80);
              auVar55[4] = -(local_e8[2].rhs._4_1_ == -0x80);
              auVar55[5] = -(local_e8[2].rhs._5_1_ == -0x80);
              auVar55[6] = -(local_e8[2].rhs._6_1_ == -0x80);
              auVar55[7] = -(local_e8[2].rhs._7_1_ == -0x80);
              auVar55[8] = -(local_e8[2].eq._0_1_ == -0x80);
              auVar55[9] = -(local_e8[2].eq._1_1_ == -0x80);
              auVar55[10] = -(local_e8[2].eq._2_1_ == -0x80);
              auVar55[0xb] = -(local_e8[2].eq._3_1_ == -0x80);
              auVar55[0xc] = -(local_e8[2].eq._4_1_ == -0x80);
              auVar55[0xd] = -(local_e8[2].eq._5_1_ == -0x80);
              auVar55[0xe] = -(local_e8[2].eq._6_1_ == -0x80);
              auVar55[0xf] = -(local_e8[2].eq._7_1_ == -0x80);
              if ((((((((((((((((auVar55 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar55 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar55 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar55 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar55 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar55 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar55 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar55 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar55 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar55 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar55 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar55 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  local_e8[2].eq._7_1_ == -0x80) {
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                ::AssertNotDebugCapacity
                          ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                            *)local_198);
                local_1e0 = (DescriptorProto *)0x0;
                pFVar45 = local_1a8;
                goto LAB_001cd93a;
              }
              uVar41 = local_1b0 + 0x10;
              if ((ulong)local_198._0_8_ < uVar41) {
                __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0xe37,
                              "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, K = std::basic_string<char>]"
                             );
              }
              local_1a0 = (DescriptorProto *)
                          (local_1b0 + (long)&local_1a0->field_0 & (ulong)pFVar45);
              bVar52 = true;
            }
            else {
LAB_001cd93a:
              bVar52 = false;
              uVar41 = local_1b0;
            }
          } while (bVar52);
          if ((local_1e0 != local_170 && local_1e0 != (DescriptorProto *)0x0) &&
             ((char)*(byte *)&(local_1e0->super_Message).super_MessageLite._vptr_MessageLite < '\0')
             ) goto LAB_001cdd5e;
          if (((DescriptorProto *)local_140._24_8_ != local_170 &&
               (DescriptorProto *)local_140._24_8_ != (DescriptorProto *)0x0) &&
             (*(ctrl_t *)local_140._24_8_ < ~kSentinel)) goto LAB_001cdd63;
          if (((DescriptorProto *)local_140._24_8_ == local_170) && (local_1e0 == local_170)) {
LAB_001cdb23:
            pDVar43 = (DescriptorProto *)local_140._24_8_;
            if (local_1e0 != (DescriptorProto *)local_140._24_8_) {
              __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xfe2,
                            "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, Args = <const std::piecewise_construct_t &, std::tuple<const std::basic_string<char> &>, std::tuple<google::protobuf::(anonymous namespace)::JsonNameDetails &>>]"
                           );
            }
            goto LAB_001cdc74;
          }
          if (((DescriptorProto *)local_140._24_8_ == local_170) != (local_1e0 == local_170))
          goto LAB_001cdd68;
          if (((DescriptorProto *)local_140._24_8_ == (DescriptorProto *)0x0) ||
             (local_1e0 == (DescriptorProto *)0x0)) goto LAB_001cdb23;
          if (((undefined1 *)local_140._24_8_ == absl::lts_20250127::container_internal::kSooControl
              ) == (local_1e0 ==
                   (DescriptorProto *)absl::lts_20250127::container_internal::kSooControl)) {
            if (local_1e0 == (DescriptorProto *)absl::lts_20250127::container_internal::kSooControl)
            {
              bVar52 = (key_equal *)_local_118 == pkVar22;
            }
            else {
              uVar42 = pkVar22;
              uVar4 = _local_118;
              pDVar43 = (DescriptorProto *)local_140._24_8_;
              if ((ulong)local_140._24_8_ < local_1e0) {
                uVar42 = _local_118;
                uVar4 = pkVar22;
                pDVar43 = local_1e0;
              }
              bVar52 = (ulong)uVar4 <= (ulong)uVar42 && pDVar43 < (ulong)uVar4;
            }
            if (bVar52) goto LAB_001cdb23;
          }
        }
        else {
          if ((DescriptorProto *)local_1d8._0_8_ == (DescriptorProto *)0x0) {
            absl::lts_20250127::raw_log_internal::RawLog
                      (kFatal,"raw_hash_set.h",0x65c,"%s called on end() iterator.","operator->");
            CheckFieldJsonNameUniqueness();
LAB_001cdd08:
            absl::lts_20250127::raw_log_internal::RawLog
                      (kFatal,"raw_hash_set.h",0x660,"%s called on default-constructed iterator.",
                       "operator->");
            CheckFieldJsonNameUniqueness();
          }
          else {
            if ((DescriptorProto *)local_1d8._0_8_ == local_170) goto LAB_001cdd08;
            if (kSentinel < *(ctrl_t *)local_1d8._0_8_) {
              ppVar39 = absl::lts_20250127::container_internal::
                        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                        ::iterator::operator*((iterator *)local_1d8);
              if ((((char)local_15c == '\0') || (local_140[0x10] != 0)) ||
                 ((ppVar39->second).is_custom != false)) {
                local_e8[0].eq = (key_equal *)&ppVar39->second;
                local_e8[0].rhs =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158;
                local_e8[1].rhs =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8;
                pDVar43 = local_1b8;
                if (((((FeatureSet *)
                      (((ThreadSafeArena *)&(local_e8[3].rhs)->_M_dataplus)->first_arena_).limit_)->
                     field_0)._impl_.json_format_ == 2) &&
                   (((ppVar39->second).is_custom & local_140[0x10]) == 0)) {
                  pcStack_70 = absl::lts_20250127::functional_internal::
                               InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
                  ;
                  local_78 = local_e8;
                  element_name_00._M_str = (char *)local_f8;
                  element_name_00._M_len = local_100;
                  make_error_01.invoker_ =
                       absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
                  ;
                  make_error_01.ptr_.obj = (void *)local_78;
                  AddWarning((DescriptorBuilder *)local_108,element_name_00,
                             &local_1b8->super_Message,NAME,make_error_01);
                }
                else {
                  pcStack_80 = absl::lts_20250127::functional_internal::
                               InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
                  ;
                  local_98._16_8_ = local_e8;
                  element_name_01._M_str = (char *)local_f8;
                  element_name_01._M_len = local_100;
                  make_error_02.invoker_ =
                       absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
                  ;
                  make_error_02.ptr_.obj = (void *)local_98._16_8_;
                  AddError((DescriptorBuilder *)local_108,element_name_01,&local_1b8->super_Message,
                           NAME,make_error_02);
                }
              }
              goto LAB_001cdc74;
            }
          }
          absl::lts_20250127::raw_log_internal::RawLog
                    (kFatal,"raw_hash_set.h",0x676,
                     "%s called on invalid iterator. The element might have been erased or the table might have rehashed. Consider running with --config=asan to diagnose rehashing issues."
                     ,"operator->");
          CheckFieldJsonNameUniqueness();
LAB_001cdd5e:
          CheckFieldJsonNameUniqueness();
LAB_001cdd63:
          CheckFieldJsonNameUniqueness();
LAB_001cdd68:
          absl::lts_20250127::raw_log_internal::RawLog
                    (kFatal,"raw_hash_set.h",0x6bf,"Invalid iterator comparison. %s",
                     "Comparing default-constructed hashtable iterator with a non-default-constructed hashtable iterator."
                    );
          CheckFieldJsonNameUniqueness();
        }
        CheckFieldJsonNameUniqueness();
LAB_001cdd98:
        __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x14c,
                      "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                     );
      }
      local_1d8._0_8_ = local_1b8;
      local_1d8._8_8_ = local_158;
      pcStack_60 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__0,std::__cxx11::string>
      ;
      local_68 = local_1d8;
      element_name._M_str = (char *)local_f8;
      element_name._M_len = local_100;
      make_error_00.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__0,std::__cxx11::string>
      ;
      make_error_00.ptr_.obj = (void *)local_68;
      pDVar43 = local_1b8;
      AddError((DescriptorBuilder *)local_108,element_name,&local_1b8->super_Message,NAME,
               make_error_00);
LAB_001cdc74:
      if ((DescriptorProto *)local_150._0_8_ != (DescriptorProto *)local_140) {
        operator_delete((void *)local_150._0_8_,local_140._0_8_ + 1);
      }
      pRVar49 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
                &(pRVar49->super_RepeatedPtrFieldBase).current_size_;
    } while ((key_equal *)pRVar49 != local_e8[3].eq);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                   *)local_198);
  return;
}

Assistant:

void DescriptorBuilder::CheckFieldJsonNameUniqueness(
    const absl::string_view message_name, const DescriptorProto& message,
    const Descriptor* descriptor, bool use_custom_names) {
  absl::flat_hash_map<std::string, JsonNameDetails> name_to_field;
  for (const FieldDescriptorProto& field : message.field()) {
    JsonNameDetails details = GetJsonNameDetails(&field, use_custom_names);
    if (details.is_custom && JsonNameLooksLikeExtension(details.orig_name)) {
      auto make_error = [&] {
        return absl::StrFormat(
            "The custom JSON name of field \"%s\" (\"%s\") is invalid: "
            "JSON names may not start with '[' and end with ']'.",
            field.name(), details.orig_name);
      };
      AddError(message_name, field, DescriptorPool::ErrorCollector::NAME,
               make_error);
      continue;
    }
    auto it_inserted = name_to_field.try_emplace(details.orig_name, details);
    if (it_inserted.second) {
      continue;
    }
    JsonNameDetails& match = it_inserted.first->second;
    if (use_custom_names && !details.is_custom && !match.is_custom) {
      // if this pass is considering custom JSON names, but neither of the
      // names involved in the conflict are custom, don't bother with a
      // message. That will have been reported from other pass (non-custom
      // JSON names).
      continue;
    }
    auto make_error = [&] {
      absl::string_view this_type = details.is_custom ? "custom" : "default";
      absl::string_view existing_type = match.is_custom ? "custom" : "default";
      // If the matched name differs (which it can only differ in case), include
      // it in the error message, for maximum clarity to user.
      std::string name_suffix = "";
      if (details.orig_name != match.orig_name) {
        name_suffix = absl::StrCat(" (\"", match.orig_name, "\")");
      }
      return absl::StrFormat(
          "The %s JSON name of field \"%s\" (\"%s\") conflicts "
          "with the %s JSON name of field \"%s\"%s.",
          this_type, field.name(), details.orig_name, existing_type,
          match.field->name(), name_suffix);
    };

    bool involves_default = !details.is_custom || !match.is_custom;
    if (descriptor->features().json_format() ==
            FeatureSet::LEGACY_BEST_EFFORT &&
        involves_default) {
      // TODO Upgrade this to an error once downstream protos
      // have been fixed.
      AddWarning(message_name, field, DescriptorPool::ErrorCollector::NAME,
                 make_error);
    } else {
      AddError(message_name, field, DescriptorPool::ErrorCollector::NAME,
               make_error);
    }
  }
}